

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initialalignment.cpp
# Opt level: O0

bool __thiscall Alignment::CalculateEuler(Alignment *this,Matrix3d *C,double *Euler)

{
  CoeffReturnType pdVar1;
  double __y;
  double *in_RDX;
  Index in_RSI;
  double dVar2;
  Index in_stack_ffffffffffffffd0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *in_stack_ffffffffffffffe0;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *this_00;
  
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffe0,in_RSI,in_stack_ffffffffffffffd0);
  dVar2 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffe0,in_RSI,in_stack_ffffffffffffffd0);
  dVar2 = atan2(dVar2,*pdVar1);
  in_RDX[2] = dVar2;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffe0,in_RSI,in_stack_ffffffffffffffd0);
  __y = -*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffe0,in_RSI,(Index)__y);
  dVar2 = *pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffe0,in_RSI,(Index)__y);
  dVar2 = sqrt(-dVar2 * *pdVar1 + 1.0);
  dVar2 = atan2(__y,dVar2);
  in_RDX[1] = dVar2;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (in_stack_ffffffffffffffe0,in_RSI,(Index)__y);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)*pdVar1;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     (this_00,in_RSI,(Index)__y);
  dVar2 = atan2((double)this_00,*pdVar1);
  *in_RDX = dVar2;
  return true;
}

Assistant:

bool Alignment::CalculateEuler(const Matrix3d C, double* Euler)
{
    Euler[2] = atan2(C(1, 0), C(0, 0));                       // roll
    Euler[1] = atan2(-C(2, 0), sqrt(1 -  C(2, 0) * C(2, 0))); // pitch
    Euler[0] = atan2(C(2, 1), C(2, 2));                       // yaw

    return true;
}